

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<tcu::Vector<int,_3>_>::
~ShaderBuiltinConstantCase(ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this)

{
  ~ShaderBuiltinConstantCase(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

ShaderBuiltinConstantCase<DataType>::~ShaderBuiltinConstantCase (void)
{
}